

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-writer-test.cc
# Opt level: O0

void __thiscall
ExprWriterTest_NotExprPrecedence_Test::TestBody(ExprWriterTest_NotExprPrecedence_Test *this)

{
  NumericExpr lhs;
  NumericExpr else_expr;
  bool bVar1;
  ExprBase this_00;
  ExprBase in_RDI;
  AssertionResult gtest_ar;
  NumericExpr x;
  NumericExpr n1;
  NumericExpr n0;
  ExprWriterTest *in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffee0;
  Kind in_stack_fffffffffffffee4;
  undefined4 uVar2;
  ExprBase in_stack_fffffffffffffef0;
  ExprBase other;
  undefined4 in_stack_fffffffffffffef8;
  int line;
  ExprBase in_stack_ffffffffffffff00;
  char *file;
  ExprBase in_stack_ffffffffffffff08;
  Type type;
  AssertHelper *in_stack_ffffffffffffff10;
  CStringRef in_stack_ffffffffffffff18;
  Message *in_stack_ffffffffffffff58;
  char local_78 [8];
  BasicCStringRef<char> local_70;
  string local_68 [32];
  AssertionResult local_48;
  BasicExpr<(mp::expr::Kind)2,_(mp::expr::Kind)3> local_38;
  BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)1> local_28;
  BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)1> local_18;
  
  local_18.super_ExprBase.impl_ =
       (ExprBase)ExprWriterTest::MakeConst(in_stack_fffffffffffffed8,6.00271973333864e-318);
  line = 0;
  mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>::BasicExpr<mp::NumericConstant>
            ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)in_RDI.impl_,
             (NumericConstant)in_stack_fffffffffffffef0.impl_,in_stack_fffffffffffffee4);
  local_28.super_ExprBase.impl_ =
       (ExprBase)ExprWriterTest::MakeConst(in_stack_fffffffffffffed8,6.00298158813094e-318);
  mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>::BasicExpr<mp::NumericConstant>
            ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)in_RDI.impl_,
             (NumericConstant)in_stack_fffffffffffffef0.impl_,in_stack_fffffffffffffee4);
  other.impl_ = (Impl *)&(((BasicExprFactory<std::allocator<char>_> *)in_RDI.impl_)->exprs_).
                         super__Vector_base<const_mp::internal::ExprBase::Impl_*,_std::allocator<const_mp::internal::ExprBase::Impl_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
  local_38.super_ExprBase.impl_ =
       (ExprBase)
       mp::BasicExprFactory<std::allocator<char>_>::MakeVariable
                 ((BasicExprFactory<std::allocator<char>_> *)in_stack_fffffffffffffed8,0);
  mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>::BasicExpr<mp::Reference>
            ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)in_RDI.impl_,(Reference)other.impl_
             ,in_stack_fffffffffffffee4);
  fmt::BasicCStringRef<char>::BasicCStringRef(&local_70,"{}");
  lhs.super_ExprBase.impl_._4_4_ = line;
  lhs.super_ExprBase.impl_._0_4_ = in_stack_fffffffffffffef8;
  mp::BasicExprFactory<std::allocator<char>_>::MakeRelational
            ((BasicExprFactory<std::allocator<char>_> *)in_RDI.impl_,in_stack_fffffffffffffee4,lhs,
             (NumericExpr)other.impl_);
  mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>::
  BasicExpr<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)53,(mp::expr::Kind)58>>
            ((BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> *)in_RDI.impl_,
             (BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)53,_(mp::expr::Kind)58>
              )other.impl_,in_stack_fffffffffffffee4);
  this_00.impl_ =
       (Impl *)mp::BasicExprFactory<std::allocator<char>_>::MakeNot
                         ((BasicExprFactory<std::allocator<char>_> *)
                          CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                          (LogicalExpr)in_RDI.impl_);
  mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>::
  BasicExpr<mp::BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,(mp::expr::Kind)49,(mp::expr::Kind)49>>
            ((BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> *)in_RDI.impl_,
             (BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)49,_(mp::expr::Kind)49>
              )other.impl_,in_stack_fffffffffffffee4);
  mp::BasicExprFactory<std::allocator<char>_>::MakeNot
            ((BasicExprFactory<std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),(LogicalExpr)in_RDI.impl_
            );
  mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>::
  BasicExpr<mp::BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,(mp::expr::Kind)49,(mp::expr::Kind)49>>
            ((BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> *)in_RDI.impl_,
             (BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)49,_(mp::expr::Kind)49>
              )other.impl_,in_stack_fffffffffffffee4);
  else_expr.super_ExprBase.impl_._4_4_ = line;
  else_expr.super_ExprBase.impl_._0_4_ = in_stack_fffffffffffffef8;
  mp::BasicExprFactory<std::allocator<char>_>::MakeIf
            ((BasicExprFactory<std::allocator<char>_> *)other.impl_,
             (LogicalExpr)in_stack_ffffffffffffff08.impl_,
             (NumericExpr)in_stack_ffffffffffffff00.impl_,else_expr);
  file = local_78;
  mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>::
  BasicExpr<mp::BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)39>>
            ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)in_RDI.impl_,
             (BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)39>)
             other.impl_,in_stack_fffffffffffffee4);
  type = (Type)((ulong)local_68 >> 0x20);
  fmt::format<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
            (in_stack_ffffffffffffff18,
             (BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)in_stack_ffffffffffffff10);
  testing::internal::EqHelper<false>::Compare<char[21],std::__cxx11::string>
            ((char *)CONCAT44(line,in_stack_fffffffffffffef8),(char *)other.impl_,
             (char (*) [21])in_RDI.impl_,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
  std::__cxx11::string::~string(local_68);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_48);
  uVar2 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffee4);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffff10);
    testing::AssertionResult::failure_message((AssertionResult *)0x128c69);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffff10,type,file,line,(char *)other.impl_);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)this_00.impl_,in_stack_ffffffffffffff58);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(uVar2,in_stack_fffffffffffffee0));
    testing::Message::~Message((Message *)0x128cb5);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x128cf8);
  return;
}

Assistant:

TEST_F(ExprWriterTest, NotExprPrecedence) {
  NumericExpr n0 = MakeConst(0), n1 = MakeConst(1), x = MakeVariable(0);
  CHECK_WRITE("if !!(x1 = 0) then 1",
      MakeIf(MakeNot(MakeNot(MakeRelational(ex::EQ, x, n0))), n1, n0));
}